

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O2

void __thiscall TasGrid::GridWavelet::loadGpuCoefficients<double>(GridWavelet *this)

{
  __uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
  __p;
  CudaWaveletData<double> *this_00;
  __uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
  local_20;
  
  this_00 = (this->gpu_cache)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
            .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl;
  if (this_00 == (CudaWaveletData<double> *)0x0) {
    Utils::make_unique<TasGrid::CudaWaveletData<double>>();
    __p._M_t.
    super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
    .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
         .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
    .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl =
         (tuple<TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
          )(_Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
            )0x0;
    ::std::
    __uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
    ::reset((__uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
             *)&this->gpu_cache,
            (pointer)__p._M_t.
                     super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
                     .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl)
    ;
    ::std::
    unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
                   *)&local_20);
    this_00 = (this->gpu_cache)._M_t.
              super___uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
              .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl;
  }
  if ((this_00->coefficients).num_entries == 0) {
    GpuVector<double>::
    load<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
              (&this_00->coefficients,(this->super_BaseCanonicalGrid).acceleration,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GridWavelet::loadGpuCoefficients() const{
    auto &ccache = getGpuCache<T>();
    if (!ccache) ccache = Utils::make_unique<CudaWaveletData<T>>();
    if (ccache->coefficients.empty()) ccache->coefficients.load(acceleration, coefficients.begin(), coefficients.end());
}